

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

Token * __thiscall Lexer::operator()(Token *__return_storage_ptr__,Lexer *this)

{
  TOK TVar1;
  Lexer *this_local;
  Token *tk;
  
  Token::Token(__return_storage_ptr__);
  TVar1 = yylex0(this);
  __return_storage_ptr__->kind = TVar1;
  __return_storage_ptr__->line = this->yytokenlineno;
  std::swap<char,std::char_traits<char>,std::allocator<char>>
            (&__return_storage_ptr__->text,&this->yytext);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::operator()() {
  Token tk;
  tk.kind = yylex0();
  tk.line = yytokenlineno;
  std::swap(tk.text, yytext);
  return tk;
}